

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

pair<llvm::DenseMapIterator<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>,_false>,_bool>
* __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,llvm::detail::DenseSetEmpty,llvm::DWARFDebugNames::AbbrevMapInfo,llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>,llvm::DWARFDebugNames::Abbrev,llvm::detail::DenseSetEmpty,llvm::DWARFDebugNames::AbbrevMapInfo,llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>
::try_emplace<llvm::detail::DenseSetEmpty&>
          (pair<llvm::DenseMapIterator<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>,_false>,_bool>
           *__return_storage_ptr__,void *this,Abbrev *Key,DenseSetEmpty *Args)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *pDVar4;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *local_30;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *ConstFoundBucket;
  
  bVar3 = DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
          ::LookupBucketFor<llvm::DWARFDebugNames::Abbrev>
                    ((DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
                      *)this,Key,&local_30);
  if (!bVar3) {
    pDVar4 = DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
             ::InsertIntoBucketImpl<llvm::DWARFDebugNames::Abbrev>
                       ((DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
                         *)this,Key,Key,local_30);
    (pDVar4->key).Code = Key->Code;
    (pDVar4->key).Tag = Key->Tag;
    std::
    vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
    ::_M_move_assign(&(pDVar4->key).Attributes,&Key->Attributes);
    local_30 = pDVar4;
  }
  uVar1 = *(uint *)((long)this + 0x10);
  lVar2 = *this;
  (__return_storage_ptr__->first).Ptr = local_30;
  (__return_storage_ptr__->first).End = (pointer)((ulong)uVar1 * 0x20 + lVar2);
  __return_storage_ptr__->second = !bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(KeyT &&Key, Ts &&... Args) {
    BucketT *TheBucket;
    if (LookupBucketFor(Key, TheBucket))
      return std::make_pair(
               makeIterator(TheBucket, getBucketsEnd(), *this, true),
               false); // Already in map.

    // Otherwise, insert the new element.
    TheBucket =
        InsertIntoBucket(TheBucket, std::move(Key), std::forward<Ts>(Args)...);
    return std::make_pair(
             makeIterator(TheBucket, getBucketsEnd(), *this, true),
             true);
  }